

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int *piVar1;
  uint *puVar2;
  undefined1 (*pauVar3) [12];
  undefined4 uVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  undefined8 uVar10;
  __m128i vH;
  __m128i vH_00;
  undefined1 auVar11 [16];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  parasail_result_t *ppVar18;
  __m128i *ptr;
  __m128i *palVar19;
  __m128i *b;
  __m128i *palVar20;
  __m128i *palVar21;
  __m128i *ptr_00;
  __m128i *b_00;
  __m128i *palVar22;
  __m128i *ptr_01;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  int32_t *ptr_02;
  uint uVar23;
  size_t len;
  __m128i *ptr_03;
  char *pcVar24;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  __m128i *ptr_04;
  char *__format;
  uint uVar25;
  int iVar26;
  long lVar27;
  uint uVar28;
  long lVar29;
  void *pvVar30;
  uint uVar31;
  uint seglen;
  int32_t iVar32;
  uint uVar33;
  __m128i *ptr_05;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  __m128i alVar42;
  undefined1 auVar43 [16];
  uint uVar44;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  __m128i alVar48;
  __m128i alVar49;
  uint uVar53;
  int iVar54;
  uint uVar60;
  uint uVar62;
  undefined1 auVar55 [16];
  int iVar61;
  int iVar63;
  uint uVar65;
  int iVar66;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  __m128i alVar58;
  long lVar64;
  __m128i alVar59;
  uint uVar67;
  ulong uVar68;
  uint uVar73;
  uint uVar74;
  uint uVar76;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  __m128i alVar71;
  long lVar75;
  __m128i alVar72;
  undefined1 auVar77 [16];
  __m128i alVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  undefined1 auVar85 [16];
  uint uVar87;
  uint uVar88;
  undefined1 auVar86 [16];
  uint uVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  int iVar95;
  int iVar96;
  int iVar97;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  int iVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  __m128i alVar104;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  uint local_220;
  int local_21c;
  undefined1 local_1e8 [16];
  uint local_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  uint local_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined4 uStack_12c;
  undefined4 uStack_fc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  __m128i_32_t e;
  __m128i_32_t h;
  longlong extraout_RDX_00;
  ulong uVar45;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar24 = "profile";
  }
  else {
    pvVar6 = (profile->profile32).score;
    if (pvVar6 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar24 = "profile->profile32.score";
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar24 = "profile->matrix";
      }
      else {
        uVar5 = profile->s1Len;
        if ((int)uVar5 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar24 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar24 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar24 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar24 = "open";
        }
        else {
          if (-1 < gap) {
            uVar14 = uVar5 - 1;
            uVar34 = (ulong)uVar5 + 3 >> 2;
            uVar36 = (ulong)uVar14 % uVar34;
            uVar28 = -open;
            uVar33 = ppVar7->min;
            uVar31 = 0x80000000 - uVar33;
            if (uVar33 != uVar28 && SBORROW4(uVar33,uVar28) == (int)(uVar33 + open) < 0) {
              uVar31 = open | 0x80000000;
            }
            pvVar8 = (profile->profile32).matches;
            uVar33 = 0x7ffffffe - ppVar7->max;
            pvVar9 = (profile->profile32).similar;
            ppVar18 = parasail_result_new_rowcol3((uint)((ulong)uVar5 + 3) & 0x7ffffffc,s2Len);
            if (ppVar18 != (parasail_result_t *)0x0) {
              iVar17 = (int)(uVar14 / uVar34);
              uVar23 = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                       (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar18->flag |
                       0x4450802;
              uVar35 = (ulong)uVar23;
              ppVar18->flag = uVar23;
              ptr = parasail_memalign___m128i(0x10,uVar34);
              palVar19 = parasail_memalign___m128i(0x10,uVar34);
              b = parasail_memalign___m128i(0x10,uVar34);
              palVar20 = parasail_memalign___m128i(0x10,uVar34);
              palVar21 = parasail_memalign___m128i(0x10,uVar34);
              ptr_00 = parasail_memalign___m128i(0x10,uVar34);
              b_00 = parasail_memalign___m128i(0x10,uVar34);
              palVar22 = parasail_memalign___m128i(0x10,uVar34);
              ptr_01 = parasail_memalign___m128i(0x10,uVar34);
              b_01 = parasail_memalign___m128i(0x10,uVar34);
              b_02 = parasail_memalign___m128i(0x10,uVar34);
              b_03 = parasail_memalign___m128i(0x10,uVar34);
              ptr_02 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              len = CONCAT71((int7)(uVar35 >> 8),ptr_01 == (__m128i *)0x0);
              alVar104[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              alVar104[1]._0_1_ = b_02 == (__m128i *)0x0;
              auVar37._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
              auVar37._8_8_ = -(ulong)(palVar19 == (__m128i *)0x0);
              auVar55._0_8_ = -(ulong)(b == (__m128i *)0x0);
              auVar55._8_8_ = -(ulong)(palVar20 == (__m128i *)0x0);
              auVar37 = packssdw(auVar37,auVar55);
              auVar99._0_8_ = -(ulong)(palVar21 == (__m128i *)0x0);
              auVar99._8_8_ = -(ulong)(ptr_00 == (__m128i *)0x0);
              auVar80._0_8_ = -(ulong)(b_00 == (__m128i *)0x0);
              auVar80._8_8_ = -(ulong)(palVar22 == (__m128i *)0x0);
              auVar55 = packssdw(auVar99,auVar80);
              auVar37 = packssdw(auVar37,auVar55);
              uVar35 = 0;
              if (((((b_01 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) && b_02 != (__m128i *)0x0)
                   && b_03 != (__m128i *)0x0) && ptr_02 != (int32_t *)0x0) &&
                  ((((((((((((((((auVar37 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                (auVar37 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar37 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar37 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar37 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar37 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar37 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar37 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar37 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar37 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar37 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar37 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar37 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar37 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar37 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar37[0xf])) {
                iVar15 = s2Len + -1;
                iVar16 = 3 - iVar17;
                uVar31 = uVar31 + 1;
                alVar104[0] = uVar34;
                parasail_memset___m128i(b,alVar104,len);
                c[1] = extraout_RDX_00;
                c[0] = uVar34;
                parasail_memset___m128i(palVar21,c,len);
                c_00[1] = extraout_RDX_01;
                c_00[0] = uVar34;
                parasail_memset___m128i(b_00,c_00,len);
                c_01[1] = extraout_RDX_02;
                c_01[0] = uVar34;
                parasail_memset___m128i(b_01,c_01,len);
                c_02[1] = extraout_RDX_03;
                c_02[0] = uVar34;
                parasail_memset___m128i(b_02,c_02,len);
                c_03[1] = extraout_RDX_04;
                c_03[0] = uVar34;
                parasail_memset___m128i(b_03,c_03,len);
                seglen = (uint)uVar34;
                uVar23 = uVar28;
                for (; uVar35 != uVar34; uVar35 = uVar35 + 1) {
                  uVar25 = uVar23;
                  for (lVar27 = 0; lVar27 != 4; lVar27 = lVar27 + 1) {
                    uVar87 = 0;
                    if (s1_beg == 0) {
                      uVar87 = uVar25;
                    }
                    *(uint *)((long)&h + lVar27 * 4) = uVar87;
                    lVar29 = (long)(int)uVar87 - (ulong)(uint)open;
                    if (lVar29 < -0x7fffffff) {
                      lVar29 = -0x80000000;
                    }
                    *(int *)((long)&e + lVar27 * 4) = (int)lVar29;
                    uVar25 = uVar25 - gap * seglen;
                  }
                  ptr[uVar35][0] = h.m[0];
                  ptr[uVar35][1] = h.m[1];
                  ptr_01[uVar35][0] = e.m[0];
                  ptr_01[uVar35][1] = e.m[1];
                  uVar23 = uVar23 - gap;
                }
                *ptr_02 = 0;
                uVar23 = uVar28;
                for (uVar35 = 1; s2Len + 1 != uVar35; uVar35 = uVar35 + 1) {
                  uVar25 = 0;
                  if (s2_beg == 0) {
                    uVar25 = uVar23;
                  }
                  ptr_02[uVar35] = uVar25;
                  uVar23 = uVar23 - gap;
                }
                uVar23 = seglen - 1;
                uVar35 = 0;
                local_b8._4_4_ = uVar31;
                local_b8._0_4_ = uVar31;
                local_b8._8_4_ = uVar31;
                local_b8._12_4_ = uVar31;
                local_c8._4_4_ = uVar31;
                local_c8._0_4_ = uVar31;
                local_c8._8_4_ = uVar31;
                local_c8._12_4_ = uVar31;
                local_d8._4_4_ = uVar31;
                local_d8._0_4_ = uVar31;
                local_d8._8_4_ = uVar31;
                local_d8._12_4_ = uVar31;
                local_1c8 = uVar31;
                uStack_1c4 = uVar31;
                uStack_1c0 = uVar31;
                uStack_1bc = uVar31;
                local_1a8 = uVar33;
                uStack_1a4 = uVar33;
                uStack_1a0 = uVar33;
                uStack_19c = uVar33;
                local_21c = iVar15;
                local_a8 = uVar31;
                uStack_a4 = uVar31;
                uStack_a0 = uVar31;
                uStack_9c = uVar31;
                do {
                  ptr_05 = palVar19;
                  ptr_04 = palVar20;
                  ptr_03 = palVar21;
                  palVar19 = palVar22;
                  if (uVar35 == (uint)s2Len) {
                    lVar27 = 0;
                    for (uVar35 = 0; uVar34 != uVar35; uVar35 = uVar35 + 1) {
                      pauVar3 = (undefined1 (*) [12])((long)*b + lVar27);
                      auVar12 = *pauVar3;
                      uStack_fc = (undefined4)((ulong)*(undefined8 *)(*pauVar3 + 8) >> 0x20);
                      pauVar3 = (undefined1 (*) [12])((long)*ptr_03 + lVar27);
                      auVar13 = *pauVar3;
                      uStack_12c = (undefined4)((ulong)*(undefined8 *)(*pauVar3 + 8) >> 0x20);
                      alVar104 = *(__m128i *)((long)*b_00 + lVar27);
                      iVar32 = (int32_t)uVar35;
                      arr_store_col(*(int **)((long)((ppVar18->field_4).trace)->trace_del_table +
                                             0x20),*(__m128i *)((long)*ptr + lVar27),iVar32,seglen);
                      vH_00[1]._4_4_ = uStack_fc;
                      vH_00._0_12_ = auVar12;
                      arr_store_col(*(int **)((long)((ppVar18->field_4).trace)->trace_del_table +
                                             0x28),vH_00,iVar32,seglen);
                      vH[1]._4_4_ = uStack_12c;
                      vH._0_12_ = auVar13;
                      arr_store_col(*(int **)((long)((ppVar18->field_4).trace)->trace_del_table +
                                             0x30),vH,iVar32,seglen);
                      arr_store_col(*(int **)((long)((ppVar18->field_4).trace)->trace_del_table +
                                             0x38),alVar104,iVar32,seglen);
                      lVar27 = lVar27 + 0x10;
                    }
                    iVar26 = 0;
                    iVar17 = 0;
                    if (s2_end == 0) {
                      iVar26 = 0;
                      iVar81 = 0;
                      local_220 = uVar31;
                    }
                    else {
                      auVar41._4_4_ = uStack_a4;
                      auVar41._0_4_ = local_a8;
                      auVar41._8_4_ = uStack_a0;
                      auVar41._12_4_ = uStack_9c;
                      while( true ) {
                        uVar34 = auVar41._0_8_;
                        lVar27 = auVar41._8_8_;
                        uVar35 = local_b8._0_8_;
                        lVar29 = local_b8._8_8_;
                        uVar45 = local_c8._0_8_;
                        lVar64 = local_c8._8_8_;
                        uVar68 = local_d8._0_8_;
                        lVar75 = local_d8._8_8_;
                        if (iVar16 <= iVar26) break;
                        auVar41._0_8_ = uVar34 << 0x20;
                        auVar41._8_8_ = lVar27 << 0x20 | uVar34 >> 0x20;
                        local_b8._0_8_ = uVar35 << 0x20;
                        local_b8._8_8_ = lVar29 << 0x20 | uVar35 >> 0x20;
                        local_c8._0_8_ = uVar45 << 0x20;
                        local_c8._8_8_ = lVar64 << 0x20 | uVar45 >> 0x20;
                        local_d8._0_8_ = uVar68 << 0x20;
                        local_d8._8_8_ = lVar75 << 0x20 | uVar68 >> 0x20;
                        iVar26 = iVar26 + 1;
                      }
                      iVar17 = local_b8._12_4_;
                      iVar26 = local_c8._12_4_;
                      iVar81 = local_d8._12_4_;
                      local_220 = auVar41._12_4_;
                    }
                    uVar28 = uVar14;
                    if (s1_end != 0) {
                      for (uVar34 = 0; (seglen & 0x1fffffff) << 2 != (uint)uVar34;
                          uVar34 = uVar34 + 1) {
                        uVar23 = ((uint)uVar34 & 3) * seglen + ((uint)(uVar34 >> 2) & 0x3fffffff);
                        if ((int)uVar23 < (int)uVar5) {
                          uVar25 = *(uint *)((long)*ptr + uVar34 * 4);
                          if (((int)local_220 < (int)uVar25) ||
                             (((uVar25 == local_220 && (local_21c == iVar15)) &&
                              (uVar25 = local_220, (int)uVar23 < (int)uVar28)))) {
                            iVar17 = *(int *)((long)*b + uVar34 * 4);
                            iVar26 = *(int *)((long)*ptr_03 + uVar34 * 4);
                            iVar81 = *(int *)((long)*b_00 + uVar34 * 4);
                            local_220 = uVar25;
                            local_21c = iVar15;
                            uVar28 = uVar23;
                          }
                        }
                      }
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      alVar42 = ptr[uVar36];
                      alVar49 = b[uVar36];
                      alVar59 = ptr_03[uVar36];
                      alVar72 = b_00[uVar36];
                      iVar17 = 0;
                      while( true ) {
                        uVar36 = alVar42[0];
                        lVar27 = alVar42[1];
                        uVar34 = alVar49[0];
                        lVar29 = alVar49[1];
                        uVar35 = alVar59[0];
                        lVar64 = alVar59[1];
                        uVar45 = alVar72[0];
                        lVar75 = alVar72[1];
                        if (iVar16 <= iVar17) break;
                        alVar42[0] = uVar36 << 0x20;
                        alVar42[1] = lVar27 << 0x20 | uVar36 >> 0x20;
                        alVar49[0] = uVar34 << 0x20;
                        alVar49[1] = lVar29 << 0x20 | uVar34 >> 0x20;
                        alVar59[0] = uVar35 << 0x20;
                        alVar59[1] = lVar64 << 0x20 | uVar35 >> 0x20;
                        alVar72[0] = uVar45 << 0x20;
                        alVar72[1] = lVar75 << 0x20 | uVar45 >> 0x20;
                        iVar17 = iVar17 + 1;
                      }
                      local_220 = alVar42[1]._4_4_;
                      iVar17 = alVar49[1]._4_4_;
                      iVar26 = alVar59[1]._4_4_;
                      iVar81 = alVar72[1]._4_4_;
                      uVar28 = uVar14;
                      local_21c = iVar15;
                    }
                    auVar43._0_4_ = -(uint)((int)local_1a8 < (int)uVar31);
                    auVar43._4_4_ = -(uint)((int)uStack_1a4 < (int)uVar31);
                    auVar43._8_4_ = -(uint)((int)uStack_1a0 < (int)uVar31);
                    auVar43._12_4_ = -(uint)((int)uStack_19c < (int)uVar31);
                    auVar79._0_4_ = -(uint)((int)uVar33 < (int)local_1c8);
                    auVar79._4_4_ = -(uint)((int)uVar33 < (int)uStack_1c4);
                    auVar79._8_4_ = -(uint)((int)uVar33 < (int)uStack_1c0);
                    auVar79._12_4_ = -(uint)((int)uVar33 < (int)uStack_1bc);
                    iVar15 = movmskps((int)b,auVar79 | auVar43);
                    if (iVar15 != 0) {
                      *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
                      local_220 = 0;
                      iVar17 = 0;
                      iVar26 = 0;
                      iVar81 = 0;
                      local_21c = 0;
                      uVar28 = 0;
                    }
                    ppVar18->score = local_220;
                    ppVar18->end_query = uVar28;
                    ppVar18->end_ref = local_21c;
                    ((ppVar18->field_4).stats)->matches = iVar17;
                    ((ppVar18->field_4).stats)->similar = iVar26;
                    ((ppVar18->field_4).stats)->length = iVar81;
                    parasail_free(ptr_02);
                    parasail_free(b_03);
                    parasail_free(b_02);
                    parasail_free(b_01);
                    parasail_free(ptr_01);
                    parasail_free(palVar19);
                    parasail_free(b_00);
                    parasail_free(ptr_00);
                    parasail_free(ptr_03);
                    parasail_free(ptr_04);
                    parasail_free(b);
                    parasail_free(ptr_05);
                    parasail_free(ptr);
                    return ppVar18;
                  }
                  palVar22 = ptr + uVar23;
                  palVar21 = b + uVar23;
                  iVar95 = (int)(*palVar21)[0];
                  iVar96 = *(int *)((long)*palVar21 + 4);
                  iVar97 = (int)(*palVar21)[1];
                  palVar21 = ptr_03 + uVar23;
                  iVar61 = (int)(*palVar21)[0];
                  iVar63 = *(int *)((long)*palVar21 + 4);
                  iVar66 = (int)(*palVar21)[1];
                  palVar21 = b_00 + uVar23;
                  iVar81 = (int)(*palVar21)[0];
                  iVar82 = *(int *)((long)*palVar21 + 4);
                  iVar83 = (int)(*palVar21)[1];
                  iVar84 = 0;
                  iVar54 = 0;
                  iVar26 = 0;
                  palVar21 = ptr + uVar23;
                  uVar4 = (undefined4)(*palVar21)[0];
                  auVar94._4_4_ = uVar4;
                  auVar94._0_4_ = uVar4;
                  auVar94._8_4_ = *(undefined4 *)((long)*palVar21 + 4);
                  auVar94._12_4_ = (int)(*palVar21)[1];
                  auVar93._4_4_ = uVar4;
                  auVar93._0_4_ = ptr_02[uVar35];
                  auVar93._8_8_ = auVar94._8_8_;
                  lVar29 = (long)(int)(ppVar7->mapper[(byte)s2[uVar35]] * seglen) * 0x10;
                  pvVar30 = (void *)((long)pvVar8 + lVar29);
                  local_178 = (undefined1  [16])0x0;
                  local_1e8 = (undefined1  [16])0x0;
                  local_168._8_8_ = 0x100000001;
                  local_168._0_8_ = 0x100000001;
                  uVar25 = uVar31;
                  uVar87 = uVar31;
                  uVar88 = uVar31;
                  uVar89 = uVar31;
                  for (lVar27 = 0; uVar34 << 4 != lVar27; lVar27 = lVar27 + 0x10) {
                    piVar1 = (int *)((long)*ptr_01 + lVar27);
                    iVar100 = *piVar1;
                    iVar101 = piVar1[1];
                    iVar102 = piVar1[2];
                    iVar103 = piVar1[3];
                    auVar37 = *(undefined1 (*) [16])((long)*b_01 + lVar27);
                    auVar55 = *(undefined1 (*) [16])((long)*b_02 + lVar27);
                    auVar99 = *(undefined1 (*) [16])((long)*b_03 + lVar27);
                    piVar1 = (int *)((long)pvVar6 + lVar27 + lVar29);
                    uVar44 = auVar93._0_4_ + *piVar1;
                    uVar50 = auVar93._4_4_ + piVar1[1];
                    uVar51 = auVar93._8_4_ + piVar1[2];
                    uVar52 = auVar93._12_4_ + piVar1[3];
                    uVar67 = (uint)((int)uVar44 < iVar100) * iVar100 |
                             ((int)uVar44 >= iVar100) * uVar44;
                    uVar73 = (uint)((int)uVar50 < iVar101) * iVar101 |
                             ((int)uVar50 >= iVar101) * uVar50;
                    uVar74 = (uint)((int)uVar51 < iVar102) * iVar102 |
                             ((int)uVar51 >= iVar102) * uVar51;
                    uVar76 = (uint)((int)uVar52 < iVar103) * iVar103 |
                             ((int)uVar52 >= iVar103) * uVar52;
                    uVar53 = ((int)uVar67 < (int)uVar25) * uVar25 |
                             ((int)uVar67 >= (int)uVar25) * uVar67;
                    uVar60 = ((int)uVar73 < (int)uVar87) * uVar87 |
                             ((int)uVar73 >= (int)uVar87) * uVar73;
                    uVar62 = ((int)uVar74 < (int)uVar88) * uVar88 |
                             ((int)uVar74 >= (int)uVar88) * uVar74;
                    uVar65 = ((int)uVar76 < (int)uVar89) * uVar89 |
                             ((int)uVar76 >= (int)uVar89) * uVar76;
                    puVar2 = (uint *)((long)*ptr_05 + lVar27);
                    *puVar2 = uVar53;
                    puVar2[1] = uVar60;
                    puVar2[2] = uVar62;
                    puVar2[3] = uVar65;
                    auVar69._0_4_ = -(uint)((int)uVar25 < (int)uVar67);
                    auVar69._4_4_ = -(uint)((int)uVar87 < (int)uVar73);
                    auVar69._8_4_ = -(uint)((int)uVar88 < (int)uVar74);
                    auVar69._12_4_ = -(uint)((int)uVar89 < (int)uVar76);
                    auVar80 = blendvps(local_178,auVar37,auVar69);
                    piVar1 = (int *)((long)pvVar30 + lVar27);
                    auVar92._0_4_ = iVar84 + *piVar1;
                    auVar92._4_4_ = iVar95 + piVar1[1];
                    auVar92._8_4_ = iVar96 + piVar1[2];
                    auVar92._12_4_ = iVar97 + piVar1[3];
                    auVar46._0_4_ = -(uint)(uVar44 == uVar53);
                    auVar46._4_4_ = -(uint)(uVar50 == uVar60);
                    auVar46._8_4_ = -(uint)(uVar51 == uVar62);
                    auVar46._12_4_ = -(uint)(uVar52 == uVar65);
                    auVar80 = blendvps(auVar80,auVar92,auVar46);
                    *(undefined1 (*) [16])((long)*ptr_04 + lVar27) = auVar80;
                    auVar93 = blendvps(local_1e8,auVar55,auVar69);
                    piVar1 = (int *)((long)pvVar9 + lVar27 + lVar29);
                    auVar90._0_4_ = iVar54 + *piVar1;
                    auVar90._4_4_ = iVar61 + piVar1[1];
                    auVar90._8_4_ = iVar63 + piVar1[2];
                    auVar90._12_4_ = iVar66 + piVar1[3];
                    auVar94 = blendvps(auVar93,auVar90,auVar46);
                    *(undefined1 (*) [16])((long)*ptr_00 + lVar27) = auVar94;
                    auVar93 = blendvps(local_168,auVar99,auVar69);
                    auVar86._0_4_ = iVar26 + 1;
                    auVar86._4_4_ = iVar81 + 1;
                    auVar86._8_4_ = iVar82 + 1;
                    auVar86._12_4_ = iVar83 + 1;
                    auVar93 = blendvps(auVar93,auVar86,auVar46);
                    *(undefined1 (*) [16])((long)*palVar19 + lVar27) = auVar93;
                    local_1a8 = ((int)uVar53 < (int)local_1a8) * uVar53 |
                                ((int)uVar53 >= (int)local_1a8) * local_1a8;
                    uStack_1a4 = ((int)uVar60 < (int)uStack_1a4) * uVar60 |
                                 ((int)uVar60 >= (int)uStack_1a4) * uStack_1a4;
                    uStack_1a0 = ((int)uVar62 < (int)uStack_1a0) * uVar62 |
                                 ((int)uVar62 >= (int)uStack_1a0) * uStack_1a0;
                    uStack_19c = ((int)uVar65 < (int)uStack_19c) * uVar65 |
                                 ((int)uVar65 >= (int)uStack_19c) * uStack_19c;
                    uVar67 = ((int)local_1c8 < (int)uVar53) * uVar53 |
                             ((int)local_1c8 >= (int)uVar53) * local_1c8;
                    uVar73 = ((int)uStack_1c4 < (int)uVar60) * uVar60 |
                             ((int)uStack_1c4 >= (int)uVar60) * uStack_1c4;
                    uVar74 = ((int)uStack_1c0 < (int)uVar62) * uVar62 |
                             ((int)uStack_1c0 >= (int)uVar62) * uStack_1c0;
                    uVar76 = ((int)uStack_1bc < (int)uVar65) * uVar65 |
                             ((int)uStack_1bc >= (int)uVar65) * uStack_1bc;
                    iVar26 = auVar93._0_4_;
                    iVar81 = auVar94._0_4_;
                    uVar44 = (uint)(iVar81 < iVar26) * iVar26 | (uint)(iVar81 >= iVar26) * iVar81;
                    iVar81 = auVar93._4_4_;
                    iVar82 = auVar94._4_4_;
                    uVar50 = (uint)(iVar82 < iVar81) * iVar81 | (uint)(iVar82 >= iVar81) * iVar82;
                    iVar82 = auVar93._8_4_;
                    iVar83 = auVar94._8_4_;
                    iVar54 = auVar94._12_4_;
                    uVar51 = (uint)(iVar83 < iVar82) * iVar82 | (uint)(iVar83 >= iVar82) * iVar83;
                    iVar83 = auVar93._12_4_;
                    uVar52 = (uint)(iVar54 < iVar83) * iVar83 | (uint)(iVar54 >= iVar83) * iVar54;
                    iVar54 = uVar53 - open;
                    iVar61 = uVar60 - open;
                    iVar63 = uVar62 - open;
                    iVar66 = uVar65 - open;
                    iVar100 = iVar100 - gap;
                    iVar101 = iVar101 - gap;
                    iVar102 = iVar102 - gap;
                    iVar103 = iVar103 - gap;
                    auVar38._0_4_ = -(uint)(iVar100 < iVar54);
                    auVar38._4_4_ = -(uint)(iVar101 < iVar61);
                    auVar38._8_4_ = -(uint)(iVar102 < iVar63);
                    auVar38._12_4_ = -(uint)(iVar103 < iVar66);
                    auVar37 = blendvps(auVar37,auVar80,auVar38);
                    auVar55 = blendvps(auVar55,auVar94,auVar38);
                    auVar98._0_4_ = auVar99._0_4_ + 1;
                    auVar98._4_4_ = auVar99._4_4_ + 1;
                    auVar98._8_4_ = auVar99._8_4_ + 1;
                    auVar98._12_4_ = auVar99._12_4_ + 1;
                    auVar91._0_4_ = iVar26 + 1;
                    auVar91._4_4_ = iVar81 + 1;
                    auVar91._8_4_ = iVar82 + 1;
                    auVar91._12_4_ = iVar83 + 1;
                    auVar99 = blendvps(auVar98,auVar91,auVar38);
                    iVar81 = uVar25 - gap;
                    iVar82 = uVar87 - gap;
                    iVar83 = uVar88 - gap;
                    iVar84 = uVar89 - gap;
                    auVar56._0_4_ = -(uint)(iVar81 < iVar54);
                    auVar56._4_4_ = -(uint)(iVar82 < iVar61);
                    auVar56._8_4_ = -(uint)(iVar83 < iVar63);
                    auVar56._12_4_ = -(uint)(iVar84 < iVar66);
                    local_178 = blendvps(local_178,auVar80,auVar56);
                    iVar26 = auVar80._0_4_;
                    uVar25 = (uint)((int)uVar67 < iVar26) * iVar26 |
                             ((int)uVar67 >= iVar26) * uVar67;
                    iVar26 = auVar80._4_4_;
                    uVar87 = (uint)((int)uVar73 < iVar26) * iVar26 |
                             ((int)uVar73 >= iVar26) * uVar73;
                    iVar26 = auVar80._8_4_;
                    uVar88 = (uint)((int)uVar74 < iVar26) * iVar26 |
                             ((int)uVar74 >= iVar26) * uVar74;
                    iVar26 = auVar80._12_4_;
                    uVar89 = (uint)((int)uVar76 < iVar26) * iVar26 |
                             ((int)uVar76 >= iVar26) * uVar76;
                    local_1c8 = ((int)uVar25 < (int)uVar44) * uVar44 |
                                ((int)uVar25 >= (int)uVar44) * uVar25;
                    uStack_1c4 = ((int)uVar87 < (int)uVar50) * uVar50 |
                                 ((int)uVar87 >= (int)uVar50) * uVar87;
                    uStack_1c0 = ((int)uVar88 < (int)uVar51) * uVar51 |
                                 ((int)uVar88 >= (int)uVar51) * uVar88;
                    uStack_1bc = ((int)uVar89 < (int)uVar52) * uVar52 |
                                 ((int)uVar89 >= (int)uVar52) * uVar89;
                    auVar70._0_4_ =
                         (uint)(iVar54 < iVar100) * iVar100 | (uint)(iVar54 >= iVar100) * iVar54;
                    auVar70._4_4_ =
                         (uint)(iVar61 < iVar101) * iVar101 | (uint)(iVar61 >= iVar101) * iVar61;
                    auVar70._8_4_ =
                         (uint)(iVar63 < iVar102) * iVar102 | (uint)(iVar63 >= iVar102) * iVar63;
                    auVar70._12_4_ =
                         (uint)(iVar66 < iVar103) * iVar103 | (uint)(iVar66 >= iVar103) * iVar66;
                    *(undefined1 (*) [16])((long)*ptr_01 + lVar27) = auVar70;
                    *(undefined1 (*) [16])((long)*b_01 + lVar27) = auVar37;
                    *(undefined1 (*) [16])((long)*b_02 + lVar27) = auVar55;
                    *(undefined1 (*) [16])((long)*b_03 + lVar27) = auVar99;
                    uVar25 = (uint)(iVar54 < iVar81) * iVar81 | (uint)(iVar54 >= iVar81) * iVar54;
                    uVar87 = (uint)(iVar61 < iVar82) * iVar82 | (uint)(iVar61 >= iVar82) * iVar61;
                    uVar88 = (uint)(iVar63 < iVar83) * iVar83 | (uint)(iVar63 >= iVar83) * iVar63;
                    uVar89 = (uint)(iVar66 < iVar84) * iVar84 | (uint)(iVar66 >= iVar84) * iVar66;
                    local_1e8 = blendvps(local_1e8,auVar94,auVar56);
                    auVar77._0_4_ = local_168._0_4_ + 1;
                    auVar77._4_4_ = local_168._4_4_ + 1;
                    auVar77._8_4_ = local_168._8_4_ + 1;
                    auVar77._12_4_ = local_168._12_4_ + 1;
                    local_168 = blendvps(auVar77,auVar91,auVar56);
                    auVar93 = *(undefined1 (*) [16])((long)*ptr + lVar27);
                    piVar1 = (int *)((long)*b + lVar27);
                    iVar84 = *piVar1;
                    iVar95 = piVar1[1];
                    iVar96 = piVar1[2];
                    iVar97 = piVar1[3];
                    piVar1 = (int *)((long)*ptr_03 + lVar27);
                    iVar54 = *piVar1;
                    iVar61 = piVar1[1];
                    iVar63 = piVar1[2];
                    iVar66 = piVar1[3];
                    piVar1 = (int *)((long)*b_00 + lVar27);
                    iVar26 = *piVar1;
                    iVar81 = piVar1[1];
                    iVar82 = piVar1[2];
                    iVar83 = piVar1[3];
                  }
                  for (iVar26 = 0; iVar26 != 4; iVar26 = iVar26 + 1) {
                    uVar89 = uVar28;
                    if (s2_beg == 0) {
                      uVar89 = ptr_02[uVar35 + 1] - open;
                    }
                    lVar27 = local_178._8_8_;
                    uVar45 = local_178._0_8_;
                    local_178._0_8_ = uVar45 << 0x20;
                    local_178._8_8_ = lVar27 << 0x20 | uVar45 >> 0x20;
                    iVar81 = (int)(*palVar22)[0];
                    iVar82 = *(int *)((long)*palVar22 + 4);
                    iVar83 = (int)(*palVar22)[1];
                    iVar32 = ptr_02[uVar35];
                    lVar27 = local_1e8._8_8_;
                    uVar45 = local_1e8._0_8_;
                    local_1e8._0_8_ = uVar45 << 0x20;
                    local_1e8._8_8_ = lVar27 << 0x20 | uVar45 >> 0x20;
                    auVar85._0_4_ = local_168._0_4_;
                    auVar85._4_4_ = auVar85._0_4_;
                    auVar85._8_4_ = local_168._4_4_;
                    auVar85._12_4_ = local_168._8_4_;
                    local_168._8_8_ = auVar85._8_8_;
                    local_168._0_8_ = (ulong)auVar85._0_4_ << 0x20 | 1;
                    uVar44 = uVar88;
                    for (lVar27 = 0; uVar88 = uVar87, uVar87 = uVar25, uVar25 = uVar89,
                        uVar34 << 4 != lVar27; lVar27 = lVar27 + 0x10) {
                      piVar1 = (int *)((long)pvVar6 + lVar27 + lVar29);
                      iVar54 = *piVar1;
                      iVar61 = piVar1[1];
                      iVar63 = piVar1[2];
                      iVar66 = piVar1[3];
                      piVar1 = (int *)((long)*ptr_05 + lVar27);
                      iVar84 = *piVar1;
                      iVar95 = piVar1[1];
                      iVar96 = piVar1[2];
                      iVar97 = piVar1[3];
                      uVar53 = (iVar84 < (int)uVar25) * uVar25 |
                               (uint)(iVar84 >= (int)uVar25) * iVar84;
                      uVar60 = (iVar95 < (int)uVar87) * uVar87 |
                               (uint)(iVar95 >= (int)uVar87) * iVar95;
                      uVar62 = (iVar96 < (int)uVar88) * uVar88 |
                               (uint)(iVar96 >= (int)uVar88) * iVar96;
                      uVar65 = (iVar97 < (int)uVar44) * uVar44 |
                               (uint)(iVar97 >= (int)uVar44) * iVar97;
                      puVar2 = (uint *)((long)*ptr_05 + lVar27);
                      *puVar2 = uVar53;
                      puVar2[1] = uVar60;
                      puVar2[2] = uVar62;
                      puVar2[3] = uVar65;
                      auVar57._0_4_ = -(uint)(iVar32 + iVar54 == uVar53);
                      auVar57._4_4_ = -(uint)(iVar81 + iVar61 == uVar60);
                      auVar57._8_4_ = -(uint)(iVar82 + iVar63 == uVar62);
                      auVar57._12_4_ = -(uint)(iVar83 + iVar66 == uVar65);
                      auVar39._0_4_ = -(uint)((int)uVar25 < iVar84);
                      auVar39._4_4_ = -(uint)((int)uVar87 < iVar95);
                      auVar39._8_4_ = -(uint)((int)uVar88 < iVar96);
                      auVar39._12_4_ = -(uint)((int)uVar44 < iVar97);
                      auVar39 = auVar39 | auVar57;
                      auVar37 = blendvps(local_178,*(undefined1 (*) [16])((long)*ptr_04 + lVar27),
                                         auVar39);
                      *(undefined1 (*) [16])((long)*ptr_04 + lVar27) = auVar37;
                      auVar55 = blendvps(local_1e8,*(undefined1 (*) [16])((long)*ptr_00 + lVar27),
                                         auVar39);
                      *(undefined1 (*) [16])((long)*ptr_00 + lVar27) = auVar55;
                      auVar99 = blendvps(local_168,*(undefined1 (*) [16])((long)*palVar19 + lVar27),
                                         auVar39);
                      *(undefined1 (*) [16])((long)*palVar19 + lVar27) = auVar99;
                      local_1a8 = ((int)uVar53 < (int)local_1a8) * uVar53 |
                                  ((int)uVar53 >= (int)local_1a8) * local_1a8;
                      uStack_1a4 = ((int)uVar60 < (int)uStack_1a4) * uVar60 |
                                   ((int)uVar60 >= (int)uStack_1a4) * uStack_1a4;
                      uStack_1a0 = ((int)uVar62 < (int)uStack_1a0) * uVar62 |
                                   ((int)uVar62 >= (int)uStack_1a0) * uStack_1a0;
                      uStack_19c = ((int)uVar65 < (int)uStack_19c) * uVar65 |
                                   ((int)uVar65 >= (int)uStack_19c) * uStack_19c;
                      uVar89 = ((int)local_1c8 < (int)uVar53) * uVar53 |
                               ((int)local_1c8 >= (int)uVar53) * local_1c8;
                      uVar50 = ((int)uStack_1c4 < (int)uVar60) * uVar60 |
                               ((int)uStack_1c4 >= (int)uVar60) * uStack_1c4;
                      uVar51 = ((int)uStack_1c0 < (int)uVar62) * uVar62 |
                               ((int)uStack_1c0 >= (int)uVar62) * uStack_1c0;
                      uVar52 = ((int)uStack_1bc < (int)uVar65) * uVar65 |
                               ((int)uStack_1bc >= (int)uVar65) * uStack_1bc;
                      iVar81 = auVar37._0_4_;
                      uVar89 = (uint)((int)uVar89 < iVar81) * iVar81 |
                               ((int)uVar89 >= iVar81) * uVar89;
                      iVar81 = auVar37._4_4_;
                      uVar50 = (uint)((int)uVar50 < iVar81) * iVar81 |
                               ((int)uVar50 >= iVar81) * uVar50;
                      iVar81 = auVar37._8_4_;
                      uVar51 = (uint)((int)uVar51 < iVar81) * iVar81 |
                               ((int)uVar51 >= iVar81) * uVar51;
                      iVar81 = auVar37._12_4_;
                      uVar52 = (uint)((int)uVar52 < iVar81) * iVar81 |
                               ((int)uVar52 >= iVar81) * uVar52;
                      iVar82 = auVar55._4_4_;
                      iVar83 = auVar55._12_4_;
                      iVar81 = auVar99._0_4_;
                      iVar54 = auVar55._0_4_;
                      uVar67 = (uint)(iVar54 < iVar81) * iVar81 | (uint)(iVar54 >= iVar81) * iVar54;
                      iVar81 = auVar99._4_4_;
                      uVar73 = (uint)(iVar82 < iVar81) * iVar81 | (uint)(iVar82 >= iVar81) * iVar82;
                      iVar81 = auVar99._8_4_;
                      iVar82 = auVar55._8_4_;
                      uVar74 = (uint)(iVar82 < iVar81) * iVar81 | (uint)(iVar82 >= iVar81) * iVar82;
                      iVar81 = auVar99._12_4_;
                      uVar76 = (uint)(iVar83 < iVar81) * iVar81 | (uint)(iVar83 >= iVar81) * iVar83;
                      local_1c8 = ((int)uVar67 < (int)uVar89) * uVar89 |
                                  ((int)uVar67 >= (int)uVar89) * uVar67;
                      uStack_1c4 = ((int)uVar73 < (int)uVar50) * uVar50 |
                                   ((int)uVar73 >= (int)uVar50) * uVar73;
                      uStack_1c0 = ((int)uVar74 < (int)uVar51) * uVar51 |
                                   ((int)uVar74 >= (int)uVar51) * uVar74;
                      uStack_1bc = ((int)uVar76 < (int)uVar52) * uVar52 |
                                   ((int)uVar76 >= (int)uVar52) * uVar76;
                      uVar44 = uVar44 - gap;
                      auVar47._0_4_ = -(uint)((int)(uVar25 - gap) < (int)(uVar53 - open));
                      auVar47._4_4_ = -(uint)((int)(uVar87 - gap) < (int)(uVar60 - open));
                      auVar47._8_4_ = -(uint)((int)(uVar88 - gap) < (int)(uVar62 - open));
                      auVar47._12_4_ = -(uint)((int)uVar44 < (int)(uVar65 - open));
                      uVar89 = movmskps((int)pvVar30,auVar47);
                      pvVar30 = (void *)(ulong)uVar89;
                      if (uVar89 == 0xf) goto LAB_006e09dd;
                      local_178 = blendvps(local_178,auVar37,auVar47);
                      local_1e8 = blendvps(local_1e8,auVar55,auVar47);
                      auVar37 = blendvps(local_168,auVar99,auVar47);
                      local_168._0_4_ = auVar37._0_4_ + 1;
                      local_168._4_4_ = auVar37._4_4_ + 1;
                      local_168._8_4_ = auVar37._8_4_ + 1;
                      local_168._12_4_ = auVar37._12_4_ + 1;
                      piVar1 = (int *)((long)*ptr + lVar27);
                      iVar32 = *piVar1;
                      iVar81 = piVar1[1];
                      iVar82 = piVar1[2];
                      iVar83 = piVar1[3];
                      uVar89 = uVar25 - gap;
                      uVar25 = uVar87 - gap;
                      uVar87 = uVar88 - gap;
                    }
                  }
LAB_006e09dd:
                  alVar58 = ptr_05[uVar36];
                  alVar48 = ptr_04[uVar36];
                  iVar26 = (int)alVar58[0];
                  auVar40._0_4_ = -(uint)((int)local_a8 < iVar26);
                  iVar81 = alVar58[0]._4_4_;
                  auVar40._4_4_ = -(uint)((int)uStack_a4 < iVar81);
                  iVar82 = (int)alVar58[1];
                  iVar83 = alVar58[1]._4_4_;
                  auVar40._8_4_ = -(uint)((int)uStack_a0 < iVar82);
                  auVar40._12_4_ = -(uint)((int)uStack_9c < iVar83);
                  local_b8 = blendvps(local_b8,(undefined1  [16])alVar48,auVar40);
                  alVar71 = ptr_00[uVar36];
                  local_c8 = blendvps(local_c8,(undefined1  [16])alVar71,auVar40);
                  alVar78 = palVar19[uVar36];
                  local_d8 = blendvps(local_d8,(undefined1  [16])alVar78,auVar40);
                  local_a8 = (uint)((int)local_a8 < iVar26) * iVar26 |
                             ((int)local_a8 >= iVar26) * local_a8;
                  uStack_a4 = (uint)((int)uStack_a4 < iVar81) * iVar81 |
                              ((int)uStack_a4 >= iVar81) * uStack_a4;
                  uStack_a0 = (uint)((int)uStack_a0 < iVar82) * iVar82 |
                              ((int)uStack_a0 >= iVar82) * uStack_a0;
                  uStack_9c = (uint)((int)uStack_9c < iVar83) * iVar83 |
                              ((int)uStack_9c >= iVar83) * uStack_9c;
                  auVar11._4_4_ = -(uint)(iVar16 == 2);
                  auVar11._0_4_ = -(uint)(iVar16 == 3);
                  auVar11._8_4_ = -(uint)(iVar16 == 1);
                  auVar11._12_4_ = -(uint)(iVar17 == 3);
                  auVar40 = auVar40 & auVar11;
                  iVar26 = 0;
                  while( true ) {
                    uVar45 = alVar58[0];
                    lVar27 = alVar58[1];
                    if (iVar16 <= iVar26) break;
                    alVar58[0] = uVar45 << 0x20;
                    alVar58[1] = lVar27 << 0x20 | uVar45 >> 0x20;
                    lVar27 = alVar48[1];
                    uVar45 = alVar48[0];
                    alVar48[0] = uVar45 << 0x20;
                    alVar48[1] = lVar27 << 0x20 | uVar45 >> 0x20;
                    lVar27 = alVar71[1];
                    uVar45 = alVar71[0];
                    alVar71[0] = uVar45 << 0x20;
                    alVar71[1] = lVar27 << 0x20 | uVar45 >> 0x20;
                    lVar27 = alVar78[1];
                    uVar45 = alVar78[0];
                    alVar78[0] = uVar45 << 0x20;
                    alVar78[1] = lVar27 << 0x20 | uVar45 >> 0x20;
                    iVar26 = iVar26 + 1;
                  }
                  *(int *)(*((ppVar18->field_4).trace)->trace_del_table + uVar35 * 4) =
                       alVar58[1]._4_4_;
                  uVar10 = extractps((undefined1  [16])alVar48,3);
                  *(undefined8 *)
                   (*(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 8) + uVar35 * 4) =
                       uVar10;
                  uVar10 = extractps((undefined1  [16])alVar71,3);
                  *(undefined8 *)
                   (*(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 0x10) + uVar35 * 4
                   ) = uVar10;
                  uVar10 = extractps((undefined1  [16])alVar78,3);
                  *(undefined8 *)
                   (*(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 0x18) + uVar35 * 4
                   ) = uVar10;
                  if ((((((((((((((((auVar40 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar40 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar40 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar40 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar40 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar40 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar40 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar40 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar40 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar40 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar40 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar40 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar40 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar40[0xf] < '\0') {
                    local_21c = (int)uVar35;
                  }
                  uVar35 = uVar35 + 1;
                  palVar22 = b_00;
                  palVar21 = ptr_00;
                  palVar20 = b;
                  ptr_00 = ptr_03;
                  b = ptr_04;
                  b_00 = palVar19;
                  palVar19 = ptr;
                  ptr = ptr_05;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar24 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_stats_rowcol_striped_profile_sse41_128_32",pcVar24);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHM;
    __m128i vMaxHS;
    __m128i vMaxHL;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile32.score;
    vProfileM = (__m128i*)profile->profile32.matches;
    vProfileS = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);
        vHM = _mm_slli_si128(vHM, 4);
        vHS = _mm_slli_si128(vHS, 4);
        vHL = _mm_slli_si128(vHL, 4);

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi32(vH_dag, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi32(vH, vH_dag);
            case2 = _mm_cmpeq_epi32(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi32(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi32(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi32(vEL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vFL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 4);
            vF = _mm_slli_si128(vF, 4);
            vFM = _mm_slli_si128(vFM, 4);
            vFS = _mm_slli_si128(vFS, 4);
            vFL = _mm_slli_si128(vFL, 4);
            vHp = _mm_insert_epi32(vHp, boundary[j], 0);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            vFL = _mm_insert_epi32(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi32(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi32(vH, vHp);
                case2 = _mm_cmpeq_epi32(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi32(vH, vGapO);
                vF_ext = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi32(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi32(vFL, vOne),
                        _mm_add_epi32(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            cond_max = _mm_cmpgt_epi32(vH, vMaxH);
            vMaxH = _mm_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
        result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
        result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
            vMaxHM = _mm_slli_si128(vMaxHM, 4);
            vMaxHS = _mm_slli_si128(vMaxHS, 4);
            vMaxHL = _mm_slli_si128(vMaxHL, 4);
        }
        end_query = s1Len-1;
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        matches = (int32_t) _mm_extract_epi32(vMaxHM, 3);
        similar = (int32_t) _mm_extract_epi32(vMaxHS, 3);
        length = (int32_t) _mm_extract_epi32(vMaxHL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t *m = (int32_t*)pvHMStore;
        int32_t *s = (int32_t*)pvHSStore;
        int32_t *l = (int32_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}